

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O2

Collision * __thiscall Plane::collide(Collision *__return_storage_ptr__,Plane *this,Ray *ray)

{
  Vector3 *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_48;
  Vector3 local_40;
  
  this_00 = &this->N;
  dVar2 = Vector3::dot(this_00,&ray->V);
  Collision::Collision(__return_storage_ptr__,&this->super_Primitive);
  dVar3 = (double)((ulong)DAT_00118010 ^ (ulong)1e-05);
  if ((dVar2 < dVar3) || (1e-05 < dVar2)) {
    dVar1 = this->D;
    dVar4 = Vector3::dot(this_00,&ray->O);
    dVar2 = -(dVar4 + dVar1) / dVar2;
    if ((dVar3 <= dVar2) && (1e-05 < dVar2)) {
      __return_storage_ptr__->crash = true;
      __return_storage_ptr__->dist = dVar2;
      dVar1 = Vector3::dot(this_00,&ray->V);
      local_48 = (double)(-(ulong)(dVar1 < dVar3) & 0x3ff0000000000000 |
                         (ulong)(~(uint)(-(ulong)(dVar1 < dVar3) >> 0x20) &
                                (uint)(-(ulong)(1e-05 < dVar1) >> 0x20) & 0xbff00000) << 0x20);
      operator*(this_00,&local_48);
      (__return_storage_ptr__->N).z = local_40.z;
      (__return_storage_ptr__->N).x = (double)CONCAT44(local_40.x._4_4_,local_40.x._0_4_);
      (__return_storage_ptr__->N).y = (double)CONCAT44(local_40.y._4_4_,local_40.y._0_4_);
      Ray::travel(&local_40,ray,dVar2);
      (__return_storage_ptr__->P).z = local_40.z;
      *(undefined4 *)&(__return_storage_ptr__->P).x = local_40.x._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->P).x + 4) = local_40.x._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->P).y = local_40.y._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->P).y + 4) = local_40.y._4_4_;
      (**(this->super_Primitive)._vptr_Primitive)(&local_40,this,&__return_storage_ptr__->P);
      (__return_storage_ptr__->color).z = local_40.z;
      (__return_storage_ptr__->color).x = (double)CONCAT44(local_40.x._4_4_,local_40.x._0_4_);
      (__return_storage_ptr__->color).y = (double)CONCAT44(local_40.y._4_4_,local_40.y._0_4_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Collision Plane::collide(const Ray &ray) {
    double x = N.dot(ray.V);
    Collision coll(this);
    if (!sign(x)) return coll;
    double t = -(D + N.dot(ray.O)) / x;
    if (sign(t) <= 0) return coll;
    coll.crash = true;
    coll.dist = t;
    coll.N = N * -sign(N.dot(ray.V));
    coll.P = ray.travel(t);
    coll.color = getColor(coll.P);
    return coll;
}